

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O2

void golf_editor_draw(void)

{
  mat4 *pmVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar24;
  golf_level_t *level;
  golf_geo_t *pgVar25;
  undefined4 uVar29;
  golf_geo_point_t *pgVar26;
  golf_geo_face_t *pgVar27;
  int *piVar28;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined4 uVar33;
  golf_transform_t transform_00;
  golf_transform_t transform_01;
  golf_transform_t transform_02;
  golf_transform_t transform_03;
  golf_transform_t transform_04;
  golf_transform_t transform_05;
  golf_transform_t transform_06;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  mat4 m_03;
  mat4 m_04;
  mat4 m_05;
  mat4 m_06;
  mat4 m_07;
  mat4 m_08;
  mat4 m_09;
  mat4 m_10;
  mat4 m_11;
  mat4 m_12;
  mat4 m_13;
  mat4 m_14;
  mat4 m_15;
  mat4 m_16;
  mat4 m_17;
  mat4 m_18;
  mat4 m_19;
  mat4 m_20;
  mat4 m_21;
  mat4 m_22;
  mat4 m1;
  mat4 m_23;
  mat4 m_24;
  mat4 m_25;
  mat4 m_26;
  mat4 m_27;
  mat4 m_28;
  mat4 m_29;
  mat4 m_30;
  mat4 m_31;
  mat4 m2;
  vec3 v;
  quat q;
  vec3 v_00;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  _Bool _Var40;
  int iVar41;
  golf_config_t *cfg;
  ulong uVar42;
  golf_model_t *pgVar43;
  golf_transform_t *pgVar44;
  golf_movement_t *pgVar45;
  golf_lightmap_section_t *pgVar46;
  golf_shader_t *pgVar47;
  golf_shader_pipeline_t *pgVar48;
  golf_shader_uniform_t *pgVar49;
  golf_shader_uniform_t *uniform;
  long lVar50;
  wchar_t num_elements;
  golf_model_group_t *pgVar51;
  char *pcVar52;
  golf_material_t *pgVar53;
  golf_model_group_t *pgVar54;
  undefined8 *puVar55;
  int i_3;
  int iVar56;
  golf_entity_t *pgVar57;
  ulong uVar58;
  int i;
  long lVar59;
  long lVar60;
  int i_1;
  byte bVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  vec4 vVar65;
  vec3 vVar66;
  vec3 v_01;
  vec3 vVar67;
  vec3 vVar68;
  golf_edit_mode_entity_t gVar69;
  vec3 p1;
  undefined4 uVar70;
  undefined4 uVar72;
  undefined4 uVar74;
  undefined4 uVar76;
  float local_1198;
  float fStack_1194;
  float local_1188;
  float fStack_1184;
  float local_1174;
  int start_vertex;
  mat4 local_1138;
  long local_10f8;
  long local_10f0;
  mat4 rotation_mat;
  golf_transform_t transform;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  golf_model_t *model;
  golf_transform_t transform_2;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  golf_transform_t transform_3;
  sg_range local_fe0;
  sg_range local_fd0;
  sg_range local_fc0;
  sg_range local_fb0;
  sg_range local_fa0;
  sg_range local_f90;
  sg_range local_f80;
  sg_range local_f70;
  sg_range local_f60;
  sg_range local_f50;
  sg_range local_f40;
  golf_transform_t world_transform;
  sg_range local_ef0;
  sg_range local_ee0;
  golf_lightmap_image_t lightmap_image;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  golf_transform_t world_transform_1;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  golf_model_group_t group;
  mat4 local_d58;
  mat4 local_d18;
  mat4 local_cd8;
  mat4 local_c98;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  mat4 local_b98;
  mat4 local_b58;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  mat4 local_a98;
  mat4 local_a58;
  mat4 local_a18;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  mat4 model_mat;
  golf_transform_t moved_transform;
  int local_4c8 [2];
  int aiStack_4c0 [6];
  sg_image local_4a8;
  sg_pass_action action;
  vec3 v_02;
  vec3 v_03;
  undefined4 uVar71;
  undefined4 uVar73;
  undefined4 uVar75;
  undefined4 uVar77;
  
  auVar39 = _local_4c8;
  bVar61 = 0;
  cfg = golf_data_get_config("data/config/editor.cfg");
  action.colors[3].value.a = 0.0;
  action.depth.action = _SG_ACTION_DEFAULT;
  action.depth.value = 0.0;
  action.stencil.action = _SG_ACTION_DEFAULT;
  action.colors[3].action = _SG_ACTION_DEFAULT;
  action.colors[3].value.r = 0.0;
  action.colors[3].value.g = 0.0;
  action.colors[3].value.b = 0.0;
  action.stencil.value = '\0';
  action.stencil._5_3_ = 0;
  action._end_canary = 0;
  action.colors[2].value.r = 0.0;
  action.colors[2].value.g = 0.0;
  action.colors[2].value.b = 0.0;
  action.colors[2].value.a = 0.0;
  action.colors[1].value.g = 0.0;
  action.colors[1].value.b = 0.0;
  action.colors[1].value.a = 0.0;
  action.colors[2].action = _SG_ACTION_DEFAULT;
  action._0_16_ = ZEXT816(0x100000000);
  action.colors._12_16_ = ZEXT816(0x3f80000000000000);
  sg_begin_default_pass(&action,(int)(graphics->viewport_size).x,(int)(graphics->viewport_size).y);
  level = editor->level;
  lVar59 = 0;
  while( true ) {
    uVar42 = (ulong)(level->entities).length;
    uVar74 = (undefined4)((ulong)local_e00 >> 0x20);
    uVar76 = (undefined4)((ulong)uStack_df8 >> 0x20);
    uVar70 = (undefined4)((ulong)local_e10 >> 0x20);
    uVar72 = (undefined4)((ulong)uStack_e08 >> 0x20);
    uVar75 = (undefined4)((ulong)local_e40 >> 0x20);
    uVar77 = (undefined4)((ulong)uStack_e38 >> 0x20);
    uVar71 = (undefined4)((ulong)local_e50 >> 0x20);
    uVar73 = (undefined4)((ulong)uStack_e48 >> 0x20);
    if ((long)uVar42 <= lVar59) break;
    pgVar57 = (level->entities).data;
    if (pgVar57[lVar59].active == true) {
      pgVar57 = pgVar57 + lVar59;
      if (((WATER_ENTITY < pgVar57->type) || ((0x16U >> (pgVar57->type & 0x1f) & 1) == 0)) &&
         (pgVar43 = golf_entity_get_model(pgVar57), pgVar43 != (golf_model_t *)0x0)) {
        fVar63 = 1.0;
        if (pgVar57->type == MODEL_ENTITY) {
          fVar63 = (pgVar57->field_4).model.uv_scale;
        }
        pgVar44 = golf_entity_get_transform(pgVar57);
        if (pgVar44 != (golf_transform_t *)0x0) {
          golf_entity_get_world_transform(&world_transform,level,pgVar57);
          pgVar45 = golf_entity_get_movement(pgVar57);
          local_10f0 = lVar59;
          if (pgVar45 == (golf_movement_t *)0x0) {
            transform_02.position.z = world_transform.position.z;
            transform_02.rotation.x = world_transform.rotation.x;
            transform_02.position.x = world_transform.position.x;
            transform_02.position.y = world_transform.position.y;
            transform_02.rotation.y = world_transform.rotation.y;
            transform_02.rotation.z = world_transform.rotation.z;
            transform_02.rotation.w = world_transform.rotation.w;
            transform_02.scale.x = world_transform.scale.x;
            transform_02.scale.y = world_transform.scale.y;
            transform_02.scale.z = world_transform.scale.z;
            golf_transform_get_model_mat(transform_02);
            local_4c8 = auVar39._0_8_;
            aiStack_4c0._0_8_ = auVar39._8_8_;
            local_1138.m[0xc] = (float)local_4c8[0];
            local_1138.m[0xd] = (float)local_4c8[1];
            local_1138.m[0xe] = (float)aiStack_4c0[0];
            local_1138.m[0xf] = (float)aiStack_4c0[1];
            local_1138.m._32_8_ = moved_transform.scale._4_8_;
            local_1138.m._40_8_ = moved_transform._40_8_;
            local_1138.m._16_8_ = moved_transform.rotation._4_8_;
            local_1138.m._24_8_ = moved_transform._24_8_;
            local_1138.m[0] = moved_transform.position.x;
            local_1138.m[1] = moved_transform.position.y;
            local_1138.m[2] = moved_transform.position.z;
            local_1138.m[3] = moved_transform.rotation.x;
          }
          else {
            model_mat.m._32_8_ = *(undefined8 *)((long)&pgVar45->field_4 + 0x10);
            model_mat.m._0_8_ = *(undefined8 *)pgVar45;
            model_mat.m[2] = pgVar45->t0;
            model_mat.m[3] = pgVar45->length;
            model_mat.m._16_8_ = *(undefined8 *)&pgVar45->field_4;
            model_mat.m._24_8_ = *(undefined8 *)((long)&pgVar45->field_4 + 8);
            transform_00.position.z = world_transform.position.z;
            transform_00.rotation.x = world_transform.rotation.x;
            transform_00.position.x = world_transform.position.x;
            transform_00.position.y = world_transform.position.y;
            transform_00.rotation.y = world_transform.rotation.y;
            transform_00.rotation.z = world_transform.rotation.z;
            transform_00.rotation.w = world_transform.rotation.w;
            transform_00.scale.x = world_transform.scale.x;
            transform_00.scale.y = world_transform.scale.y;
            transform_00.scale.z = world_transform.scale.z;
            golf_transform_apply_movement(&moved_transform,transform_00,*pgVar45,editor->t);
            transform_01.position.z = moved_transform.position.z;
            transform_01.rotation.x = moved_transform.rotation.x;
            transform_01.position.x = moved_transform.position.x;
            transform_01.position.y = moved_transform.position.y;
            transform_01.rotation.y = moved_transform.rotation.y;
            transform_01.rotation.z = moved_transform.rotation.z;
            transform_01.rotation.w = moved_transform.rotation.w;
            transform_01.scale.x = moved_transform.scale.x;
            transform_01.scale.y = (float)moved_transform.scale.y;
            transform_01.scale.z = moved_transform.scale.z;
            golf_transform_get_model_mat(transform_01);
          }
          lVar60 = 0;
          while( true ) {
            lVar50 = 0x12;
            lVar59 = local_10f0;
            if ((pgVar43->groups).length <= lVar60) break;
            pgVar51 = (pgVar43->groups).data + lVar60;
            pgVar54 = &group;
            for (; lVar50 != 0; lVar50 = lVar50 + -1) {
              *(undefined4 *)pgVar54->material_name = *(undefined4 *)pgVar51->material_name;
              pgVar51 = (golf_model_group_t *)((long)pgVar51 + ((ulong)bVar61 * -2 + 1) * 4);
              pgVar54 = (golf_model_group_t *)((long)pgVar54 + (ulong)bVar61 * -8 + 4);
            }
            _Var40 = golf_level_get_material
                               (level,group.material_name,(golf_material_t *)&moved_transform);
            if (!_Var40) {
              golf_log_warning("Could not find material %s",&group);
              golf_material_texture
                        ((golf_material_t *)&model_mat,"",0.0,0.0,0.0,"data/textures/fallback.png");
              memcpy(&moved_transform,(golf_material_t *)&model_mat,0x460);
            }
            if (local_4a8.id == GOLF_MATERIAL_ENVIRONMENT) {
              pgVar46 = golf_entity_get_lightmap_section(pgVar57);
              if (pgVar46 == (golf_lightmap_section_t *)0x0) {
                golf_log_warning("Cannot use environment material on entity with no lightmap");
              }
              else {
                _Var40 = golf_level_get_lightmap_image(level,pgVar46->lightmap_name,&lightmap_image)
                ;
                iVar22 = group.vertex_count;
                iVar20 = group.start_vertex;
                if (_Var40) {
                  rotation_mat.m[0] = local_1138.m[0];
                  rotation_mat.m[1] = local_1138.m[1];
                  rotation_mat.m[2] = local_1138.m[2];
                  rotation_mat.m[3] = local_1138.m[3];
                  rotation_mat.m[4] = local_1138.m[4];
                  rotation_mat.m[5] = local_1138.m[5];
                  rotation_mat.m[6] = local_1138.m[6];
                  rotation_mat.m[7] = local_1138.m[7];
                  rotation_mat.m[8] = local_1138.m[8];
                  rotation_mat.m[9] = local_1138.m[9];
                  rotation_mat.m[10] = local_1138.m[10];
                  rotation_mat.m[0xb] = local_1138.m[0xb];
                  rotation_mat.m[0xc] = local_1138.m[0xc];
                  rotation_mat.m[0xd] = local_1138.m[0xd];
                  rotation_mat.m[0xe] = local_1138.m[0xe];
                  rotation_mat.m[0xf] = local_1138.m[0xf];
                  pgVar47 = golf_data_get_shader("data/shaders/environment_material.glsl");
                  pgVar48 = golf_shader_get_pipeline(pgVar47,"environment_material");
                  sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
                  pgVar49 = golf_shader_get_vs_uniform(pgVar47,"environment_material_vs_params");
                  model_mat.m._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
                  model_mat.m._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
                  model_mat.m._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 4);
                  model_mat.m._24_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 6);
                  model_mat.m._32_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 8);
                  model_mat.m._40_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
                  model_mat.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
                  model_mat.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
                  m.m[5] = model_mat.m[5];
                  m.m._0_20_ = *(undefined1 (*) [20])(graphics->proj_view_mat).m;
                  m.m[6] = model_mat.m[6];
                  m.m[7] = model_mat.m[7];
                  m.m[8] = model_mat.m[8];
                  m.m[9] = model_mat.m[9];
                  m.m[10] = model_mat.m[10];
                  m.m[0xb] = model_mat.m[0xb];
                  m.m[0xc] = model_mat.m[0xc];
                  m.m[0xd] = model_mat.m[0xd];
                  m.m[0xe] = model_mat.m[0xe];
                  m.m[0xf] = model_mat.m[0xf];
                  mat4_transpose(m);
                  m_00.m._8_8_ = uStack_e18;
                  m_00.m._0_8_ = local_e20;
                  m_00.m[4] = (float)(int)local_e10;
                  m_00.m[5] = (float)uVar70;
                  m_00.m[6] = (float)(int)uStack_e08;
                  m_00.m[7] = (float)uVar72;
                  m_00.m[8] = (float)(int)local_e00;
                  m_00.m[9] = (float)uVar74;
                  m_00.m[10] = (float)(int)uStack_df8;
                  m_00.m[0xb] = (float)uVar76;
                  m_00.m._48_8_ = local_df0;
                  m_00.m._56_8_ = uStack_de8;
                  golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_00);
                  m_01.m[3] = rotation_mat.m[3];
                  m_01.m[2] = rotation_mat.m[2];
                  m_01.m[0] = rotation_mat.m[0];
                  m_01.m[1] = rotation_mat.m[1];
                  m_01.m[4] = rotation_mat.m[4];
                  m_01.m[5] = rotation_mat.m[5];
                  m_01.m[6] = rotation_mat.m[6];
                  m_01.m[7] = rotation_mat.m[7];
                  m_01.m[8] = rotation_mat.m[8];
                  m_01.m[9] = rotation_mat.m[9];
                  m_01.m[10] = rotation_mat.m[10];
                  m_01.m[0xb] = rotation_mat.m[0xb];
                  m_01.m[0xc] = rotation_mat.m[0xc];
                  m_01.m[0xd] = rotation_mat.m[0xd];
                  m_01.m[0xe] = rotation_mat.m[0xe];
                  m_01.m[0xf] = rotation_mat.m[0xf];
                  mat4_transpose(m_01);
                  m_02.m._8_8_ = uStack_e58;
                  m_02.m._0_8_ = local_e60;
                  m_02.m[4] = (float)(int)local_e50;
                  m_02.m[5] = (float)uVar71;
                  m_02.m[6] = (float)(int)uStack_e48;
                  m_02.m[7] = (float)uVar73;
                  m_02.m[8] = (float)(int)local_e40;
                  m_02.m[9] = (float)uVar75;
                  m_02.m[10] = (float)(int)uStack_e38;
                  m_02.m[0xb] = (float)uVar77;
                  m_02.m._48_8_ = local_e30;
                  m_02.m._56_8_ = uStack_e28;
                  golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_02);
                  local_d18.m._0_8_ = pgVar49->data;
                  local_d18.m._8_8_ = SEXT48(pgVar49->size);
                  sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',(sg_range *)&local_d18);
                  iVar23 = lightmap_image.num_samples;
                  if (lightmap_image.num_samples < 2 || lightmap_image.time_length <= 0.0) {
                    local_10f8 = 0;
                    local_1174 = 0.0;
                  }
                  else {
                    fVar62 = fmodf(editor->t,lightmap_image.time_length);
                    fVar62 = fVar62 / lightmap_image.time_length;
                    if ((lightmap_image.repeats == true) && (fVar62 = fVar62 + fVar62, 1.0 < fVar62)
                       ) {
                      fVar62 = 2.0 - fVar62;
                    }
                    for (iVar56 = 1; iVar56 < iVar23; iVar56 = iVar56 + 1) {
                      if (fVar62 < (float)iVar56 / (float)(iVar23 + -1)) {
                        iVar41 = iVar56 + -1;
                        goto LAB_0010daa6;
                      }
                    }
                    iVar56 = 0;
                    iVar41 = 0;
LAB_0010daa6:
                    fVar64 = (float)iVar41 / ((float)iVar23 + -1.0);
                    local_1174 = golf_clampf((fVar62 - fVar64) /
                                             ((float)iVar56 / ((float)iVar23 + -1.0) - fVar64),0.0,
                                             1.0);
                    local_10f8 = (long)iVar41;
                  }
                  pgVar49 = golf_shader_get_fs_uniform(pgVar47,"environment_material_fs_params");
                  vVar65 = vec4_create(0.0,0.0,0.0,0.0);
                  golf_shader_uniform_set_vec4(pgVar49,"ball_position",vVar65);
                  golf_shader_uniform_set_float(pgVar49,"lightmap_texture_a",local_1174);
                  golf_shader_uniform_set_float(pgVar49,"uv_scale",fVar63);
                  local_d58.m._0_8_ = pgVar49->data;
                  local_d58.m._8_8_ = SEXT48(pgVar49->size);
                  sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',(sg_range *)&local_d58);
                  memset((sg_bindings *)&model_mat,0,0xb0);
                  model_mat.m[1] = (float)(pgVar43->sg_positions_buf).id;
                  uVar4 = pgVar43->sg_normals_buf;
                  uVar12 = pgVar43->sg_texcoords_buf;
                  model_mat.m[3] = (float)uVar4;
                  model_mat.m[2] = (float)uVar12;
                  model_mat.m[4] = (float)(pgVar46->sg_uvs_buf).id;
                  sg_apply_bindings((sg_bindings *)&model_mat);
                  sg_draw(iVar20,iVar22,L'\x01');
                }
                else {
                  golf_log_warning("Could not find lightmap %s",pgVar46);
                }
              }
            }
            lVar60 = lVar60 + 1;
          }
        }
      }
    }
    lVar59 = lVar59 + 1;
  }
  lVar59 = 0;
  for (lVar60 = 0; lVar60 < (int)uVar42; lVar60 = lVar60 + 1) {
    pgVar57 = (level->entities).data;
    iVar20 = *(int *)(pgVar57->name + lVar59 + -4);
    pgVar57 = (golf_entity_t *)(pgVar57->name + lVar59 + -0xc);
    if (((editor->entity_settings).draw_camera_zones == true) && (iVar20 == 7)) {
      golf_entity_get_world_transform(&transform,level,pgVar57);
      vVar67.z = transform.position.z;
      vVar67.x = transform.position.x;
      vVar67.y = transform.position.y;
      mat4_translation((mat4 *)&lightmap_image,vVar67);
      v_00.y = transform.scale.y;
      v_00.z = transform.scale.z;
      v_00.x = transform.scale.x;
      mat4_scale((mat4 *)&group,v_00);
      mat4_multiply_n(&model_mat,2);
      pgVar43 = golf_data_get_model("data/models/cube.obj");
      golf_data_get_texture("data/textures/colors/red.png");
      pgVar47 = golf_data_get_shader("data/shaders/texture_material.glsl");
      pgVar48 = golf_shader_get_pipeline(pgVar47,"texture_material");
      sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
      pgVar49 = golf_shader_get_vs_uniform(pgVar47,"texture_material_vs_params");
      pmVar1 = &graphics->proj_view_mat;
      moved_transform.position.x = pmVar1->m[0];
      moved_transform.position.y = pmVar1->m[1];
      moved_transform.position.z = (graphics->proj_view_mat).m[2];
      moved_transform.rotation.x = (graphics->proj_view_mat).m[3];
      pfVar2 = (graphics->proj_view_mat).m + 4;
      uVar30 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      moved_transform._16_16_ = *(undefined1 (*) [16])pfVar2;
      pfVar3 = (graphics->proj_view_mat).m + 8;
      uVar31 = *(undefined8 *)pfVar3;
      uVar32 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      unique0x10009c3d = *(undefined1 (*) [16])pfVar3;
      m_03.m[5] = (float)(int)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      m_03.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m_03.m[6] = (float)(int)uVar30;
      m_03.m[7] = (float)(int)((ulong)uVar30 >> 0x20);
      m_03.m[8] = (float)(int)uVar31;
      m_03.m[9] = (float)(int)((ulong)uVar31 >> 0x20);
      m_03.m[10] = (float)(int)uVar32;
      m_03.m[0xb] = (float)(int)((ulong)uVar32 >> 0x20);
      m_03.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      m_03.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      mat4_transpose(m_03);
      m_04.m._8_8_ = uStack_e18;
      m_04.m._0_8_ = local_e20;
      m_04.m[4] = (float)(int)local_e10;
      m_04.m[5] = (float)uVar70;
      m_04.m[6] = (float)(int)uStack_e08;
      m_04.m[7] = (float)uVar72;
      m_04.m[8] = (float)(int)local_e00;
      m_04.m[9] = (float)uVar74;
      m_04.m[10] = (float)(int)uStack_df8;
      m_04.m[0xb] = (float)uVar76;
      m_04.m._48_8_ = local_df0;
      m_04.m._56_8_ = uStack_de8;
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_04);
      m_05.m[2] = model_mat.m[2];
      m_05.m[3] = model_mat.m[3];
      m_05.m[0] = model_mat.m[0];
      m_05.m[1] = model_mat.m[1];
      m_05.m[4] = model_mat.m[4];
      m_05.m[5] = model_mat.m[5];
      m_05.m[6] = model_mat.m[6];
      m_05.m[7] = model_mat.m[7];
      m_05.m[8] = model_mat.m[8];
      m_05.m[9] = model_mat.m[9];
      m_05.m[10] = model_mat.m[10];
      m_05.m[0xb] = model_mat.m[0xb];
      m_05.m[0xc] = model_mat.m[0xc];
      m_05.m[0xd] = model_mat.m[0xd];
      m_05.m[0xe] = model_mat.m[0xe];
      m_05.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_05);
      m_06.m._8_8_ = uStack_e58;
      m_06.m._0_8_ = local_e60;
      m_06.m[4] = (float)(int)local_e50;
      m_06.m[5] = (float)uVar71;
      m_06.m[6] = (float)(int)uStack_e48;
      m_06.m[7] = (float)uVar73;
      m_06.m[8] = (float)(int)local_e40;
      m_06.m[9] = (float)uVar75;
      m_06.m[10] = (float)(int)uStack_e38;
      m_06.m[0xb] = (float)uVar77;
      m_06.m._48_8_ = local_e30;
      m_06.m._56_8_ = uStack_e28;
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_06);
      local_ee0.ptr = pgVar49->data;
      local_ee0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_ee0);
      uniform = golf_shader_get_fs_uniform(pgVar47,"fs_params");
      golf_shader_uniform_set_float(uniform,"alpha",0.4);
      local_ef0.ptr = uniform->data;
      local_ef0.size = (size_t)uniform->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_ef0);
      memset((sg_bindings *)&moved_transform,0,0xb0);
      moved_transform.position.y = (float)(pgVar43->sg_positions_buf).id;
      uVar5 = pgVar43->sg_normals_buf;
      uVar13 = pgVar43->sg_texcoords_buf;
      moved_transform.rotation.x = (float)uVar5;
      moved_transform.position.z = (float)uVar13;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      sg_draw(L'\0',(pgVar43->positions).length,L'\x01');
      q.y = transform.rotation.y;
      q.z = transform.rotation.z;
      q.x = transform.rotation.x;
      q.w = transform.rotation.w;
      mat4_from_quat(&rotation_mat,q);
      vVar68.z = transform.position.z;
      vVar68.x = transform.position.x;
      vVar68.y = transform.position.y;
      mat4_translation((mat4 *)&world_transform,vVar68);
      vVar66 = vec3_create(1.0,0.1,0.1);
      mat4_scale(&local_d18,vVar66);
      vVar66 = vec3_create(1.0,0.5,0.0);
      mat4_translation(&local_d58,vVar66);
      mat4_multiply_n(&local_1138,4);
      model_mat.m[0xc] = local_1138.m[0xc];
      model_mat.m[0xd] = local_1138.m[0xd];
      model_mat.m[0xe] = local_1138.m[0xe];
      model_mat.m[0xf] = local_1138.m[0xf];
      model_mat.m[8] = local_1138.m[8];
      model_mat.m[9] = local_1138.m[9];
      model_mat.m[10] = local_1138.m[10];
      model_mat.m[0xb] = local_1138.m[0xb];
      model_mat.m[4] = local_1138.m[4];
      model_mat.m[5] = local_1138.m[5];
      model_mat.m[6] = local_1138.m[6];
      model_mat.m[7] = local_1138.m[7];
      model_mat.m[0] = local_1138.m[0];
      model_mat.m[1] = local_1138.m[1];
      model_mat.m[2] = local_1138.m[2];
      model_mat.m[3] = local_1138.m[3];
      local_1138.m._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
      local_1138.m._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
      local_1138.m._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 4);
      local_1138.m._24_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      local_1138.m._32_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 8);
      local_1138.m._40_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      local_1138.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      local_1138.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      m_07.m[5] = local_1138.m[5];
      m_07.m._0_20_ = *(undefined1 (*) [20])(graphics->proj_view_mat).m;
      m_07.m[6] = local_1138.m[6];
      m_07.m[7] = local_1138.m[7];
      m_07.m[8] = local_1138.m[8];
      m_07.m[9] = local_1138.m[9];
      m_07.m[10] = local_1138.m[10];
      m_07.m[0xb] = local_1138.m[0xb];
      m_07.m[0xc] = local_1138.m[0xc];
      m_07.m[0xd] = local_1138.m[0xd];
      m_07.m[0xe] = local_1138.m[0xe];
      m_07.m[0xf] = local_1138.m[0xf];
      mat4_transpose(m_07);
      m_08.m[2] = (float)(undefined4)uStack_990;
      m_08.m[3] = (float)uStack_990._4_4_;
      m_08.m[0] = (float)(undefined4)local_998;
      m_08.m[1] = (float)local_998._4_4_;
      m_08.m[4] = (float)(int)local_988;
      m_08.m[5] = (float)(int)((ulong)local_988 >> 0x20);
      m_08.m[6] = (float)(int)uStack_980;
      m_08.m[7] = (float)(int)((ulong)uStack_980 >> 0x20);
      m_08.m[8] = (float)(int)local_978;
      m_08.m[9] = (float)(int)((ulong)local_978 >> 0x20);
      m_08.m[10] = (float)(int)uStack_970;
      m_08.m[0xb] = (float)(int)((ulong)uStack_970 >> 0x20);
      m_08.m[0xc] = (float)(undefined4)local_968;
      m_08.m[0xd] = (float)local_968._4_4_;
      m_08.m[0xe] = (float)(undefined4)uStack_960;
      m_08.m[0xf] = (float)uStack_960._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_08);
      m_09.m[2] = model_mat.m[2];
      m_09.m[3] = model_mat.m[3];
      m_09.m[0] = model_mat.m[0];
      m_09.m[1] = model_mat.m[1];
      m_09.m[4] = model_mat.m[4];
      m_09.m[5] = model_mat.m[5];
      m_09.m[6] = model_mat.m[6];
      m_09.m[7] = model_mat.m[7];
      m_09.m[8] = model_mat.m[8];
      m_09.m[9] = model_mat.m[9];
      m_09.m[10] = model_mat.m[10];
      m_09.m[0xb] = model_mat.m[0xb];
      m_09.m[0xc] = model_mat.m[0xc];
      m_09.m[0xd] = model_mat.m[0xd];
      m_09.m[0xe] = model_mat.m[0xe];
      m_09.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_09);
      m_10.m[2] = (float)(undefined4)uStack_9d0;
      m_10.m[3] = (float)uStack_9d0._4_4_;
      m_10.m[0] = (float)(undefined4)local_9d8;
      m_10.m[1] = (float)local_9d8._4_4_;
      m_10.m[4] = (float)(int)local_9c8;
      m_10.m[5] = (float)(int)((ulong)local_9c8 >> 0x20);
      m_10.m[6] = (float)(int)uStack_9c0;
      m_10.m[7] = (float)(int)((ulong)uStack_9c0 >> 0x20);
      m_10.m[8] = (float)(int)local_9b8;
      m_10.m[9] = (float)(int)((ulong)local_9b8 >> 0x20);
      m_10.m[10] = (float)(int)uStack_9b0;
      m_10.m[0xb] = (float)(int)((ulong)uStack_9b0 >> 0x20);
      m_10.m[0xc] = (float)(undefined4)local_9a8;
      m_10.m[0xd] = (float)local_9a8._4_4_;
      m_10.m[0xe] = (float)(undefined4)uStack_9a0;
      m_10.m[0xf] = (float)uStack_9a0._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_10);
      local_f40.ptr = pgVar49->data;
      local_f40.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f40);
      golf_shader_uniform_set_float(uniform,"alpha",1.0);
      local_f50.ptr = uniform->data;
      local_f50.size = (size_t)uniform->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f50);
      moved_transform.position._0_8_ = (ulong)(pgVar43->sg_positions_buf).id << 0x20;
      uVar6 = pgVar43->sg_normals_buf;
      uVar14 = pgVar43->sg_texcoords_buf;
      moved_transform.rotation.x = (float)uVar6;
      moved_transform.position.z = (float)uVar14;
      stack0xfffffffffffffb28 = (undefined1  [16])0x0;
      moved_transform.rotation.y = 0.0;
      moved_transform.rotation.z = 0.0;
      moved_transform.rotation.w = 0.0;
      moved_transform.scale.x = 0.0;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      sg_draw(L'\0',(pgVar43->positions).length,L'\x01');
      pgVar43 = golf_data_get_model("data/models/sphere.obj");
      v.z = transform.position.z;
      v.x = transform.position.x;
      v.y = transform.position.y;
      mat4_translation(&local_a18,v);
      vVar66 = vec3_create(2.0,0.1,0.0);
      mat4_translation(&local_a58,vVar66);
      vVar66 = vec3_create(0.2,0.2,0.2);
      mat4_scale(&local_a98,vVar66);
      mat4_multiply_n(&local_1138,4);
      model_mat.m[0xc] = local_1138.m[0xc];
      model_mat.m[0xd] = local_1138.m[0xd];
      model_mat.m[0xe] = local_1138.m[0xe];
      model_mat.m[0xf] = local_1138.m[0xf];
      model_mat.m[8] = local_1138.m[8];
      model_mat.m[9] = local_1138.m[9];
      model_mat.m[10] = local_1138.m[10];
      model_mat.m[0xb] = local_1138.m[0xb];
      model_mat.m[4] = local_1138.m[4];
      model_mat.m[5] = local_1138.m[5];
      model_mat.m[6] = local_1138.m[6];
      model_mat.m[7] = local_1138.m[7];
      model_mat.m[0] = local_1138.m[0];
      model_mat.m[1] = local_1138.m[1];
      model_mat.m[2] = local_1138.m[2];
      model_mat.m[3] = local_1138.m[3];
      pmVar1 = &graphics->proj_view_mat;
      local_1138.m[0] = pmVar1->m[0];
      local_1138.m[1] = pmVar1->m[1];
      local_1138.m[2] = (graphics->proj_view_mat).m[2];
      local_1138.m[3] = (graphics->proj_view_mat).m[3];
      local_1138.m._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 4);
      local_1138.m._24_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      local_1138.m._32_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 8);
      local_1138.m._40_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      local_1138.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      local_1138.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      m_11.m[5] = local_1138.m[5];
      m_11.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m_11.m[6] = local_1138.m[6];
      m_11.m[7] = local_1138.m[7];
      m_11.m[8] = local_1138.m[8];
      m_11.m[9] = local_1138.m[9];
      m_11.m[10] = local_1138.m[10];
      m_11.m[0xb] = local_1138.m[0xb];
      m_11.m[0xc] = (float)local_1138.m[0xc];
      m_11.m[0xd] = (float)local_1138.m[0xd];
      m_11.m[0xe] = (float)local_1138.m[0xe];
      m_11.m[0xf] = (float)local_1138.m[0xf];
      mat4_transpose(m_11);
      m_12.m[2] = (float)(undefined4)uStack_ad0;
      m_12.m[3] = (float)uStack_ad0._4_4_;
      m_12.m[0] = (float)(undefined4)local_ad8;
      m_12.m[1] = (float)local_ad8._4_4_;
      m_12.m[4] = (float)(int)local_ac8;
      m_12.m[5] = (float)(int)((ulong)local_ac8 >> 0x20);
      m_12.m[6] = (float)(int)uStack_ac0;
      m_12.m[7] = (float)(int)((ulong)uStack_ac0 >> 0x20);
      m_12.m[8] = (float)(int)local_ab8;
      m_12.m[9] = (float)(int)((ulong)local_ab8 >> 0x20);
      m_12.m[10] = (float)(int)uStack_ab0;
      m_12.m[0xb] = (float)(int)((ulong)uStack_ab0 >> 0x20);
      m_12.m[0xc] = (float)(undefined4)local_aa8;
      m_12.m[0xd] = (float)local_aa8._4_4_;
      m_12.m[0xe] = (float)(undefined4)uStack_aa0;
      m_12.m[0xf] = (float)uStack_aa0._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_12);
      m_13.m[2] = model_mat.m[2];
      m_13.m[3] = model_mat.m[3];
      m_13.m[0] = model_mat.m[0];
      m_13.m[1] = model_mat.m[1];
      m_13.m[4] = model_mat.m[4];
      m_13.m[5] = model_mat.m[5];
      m_13.m[6] = model_mat.m[6];
      m_13.m[7] = model_mat.m[7];
      m_13.m[8] = model_mat.m[8];
      m_13.m[9] = model_mat.m[9];
      m_13.m[10] = model_mat.m[10];
      m_13.m[0xb] = model_mat.m[0xb];
      m_13.m[0xc] = model_mat.m[0xc];
      m_13.m[0xd] = model_mat.m[0xd];
      m_13.m[0xe] = model_mat.m[0xe];
      m_13.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_13);
      m_14.m[2] = (float)(undefined4)uStack_b10;
      m_14.m[3] = (float)uStack_b10._4_4_;
      m_14.m[0] = (float)(undefined4)local_b18;
      m_14.m[1] = (float)local_b18._4_4_;
      m_14.m[4] = (float)(int)local_b08;
      m_14.m[5] = (float)(int)((ulong)local_b08 >> 0x20);
      m_14.m[6] = (float)(int)uStack_b00;
      m_14.m[7] = (float)(int)((ulong)uStack_b00 >> 0x20);
      m_14.m[8] = (float)(int)local_af8;
      m_14.m[9] = (float)(int)((ulong)local_af8 >> 0x20);
      m_14.m[10] = (float)(int)uStack_af0;
      m_14.m[0xb] = (float)(int)((ulong)uStack_af0 >> 0x20);
      m_14.m[0xc] = (float)(undefined4)local_ae8;
      m_14.m[0xd] = (float)local_ae8._4_4_;
      m_14.m[0xe] = (float)(undefined4)uStack_ae0;
      m_14.m[0xf] = (float)uStack_ae0._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_14);
      local_f60.ptr = pgVar49->data;
      local_f60.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f60);
      golf_shader_uniform_set_float(uniform,"alpha",1.0);
      local_f70.ptr = uniform->data;
      local_f70.size = (size_t)uniform->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f70);
      moved_transform.position._0_8_ = (ulong)(pgVar43->sg_positions_buf).id << 0x20;
      uVar7 = pgVar43->sg_normals_buf;
      uVar15 = pgVar43->sg_texcoords_buf;
      moved_transform.rotation.x = (float)uVar7;
      moved_transform.position.z = (float)uVar15;
      stack0xfffffffffffffb28 = (undefined1  [16])0x0;
      moved_transform.rotation.y = 0.0;
      moved_transform.rotation.z = 0.0;
      moved_transform.rotation.w = 0.0;
      moved_transform.scale.x = 0.0;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      num_elements = (pgVar43->positions).length;
LAB_0010eb62:
      sg_draw(L'\0',num_elements,L'\x01');
    }
    else if (iVar20 == 1) {
      pgVar43 = golf_data_get_model("data/models/sphere.obj");
      golf_data_get_texture("data/textures/colors/red.png");
      golf_entity_get_world_transform((golf_transform_t *)&rotation_mat,level,pgVar57);
      vVar66.z = rotation_mat.m[2];
      vVar66.x = rotation_mat.m[0];
      vVar66.y = rotation_mat.m[1];
      mat4_translation(&local_b58,vVar66);
      vVar66 = vec3_create(0.12,0.12,0.12);
      mat4_scale(&local_b98,vVar66);
      mat4_multiply_n(&model_mat,2);
      pgVar47 = golf_data_get_shader("data/shaders/texture_material.glsl");
      pgVar48 = golf_shader_get_pipeline(pgVar47,"texture_material");
      sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
      pgVar49 = golf_shader_get_vs_uniform(pgVar47,"texture_material_vs_params");
      pmVar1 = &graphics->proj_view_mat;
      moved_transform.position.x = pmVar1->m[0];
      moved_transform.position.y = pmVar1->m[1];
      moved_transform.position.z = (graphics->proj_view_mat).m[2];
      moved_transform.rotation.x = (graphics->proj_view_mat).m[3];
      pfVar2 = (graphics->proj_view_mat).m + 4;
      uVar30 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      moved_transform._16_16_ = *(undefined1 (*) [16])pfVar2;
      pfVar3 = (graphics->proj_view_mat).m + 8;
      uVar31 = *(undefined8 *)pfVar3;
      uVar32 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      unique0x10009ce9 = *(undefined1 (*) [16])pfVar3;
      m_15.m[5] = (float)(int)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      m_15.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m_15.m[6] = (float)(int)uVar30;
      m_15.m[7] = (float)(int)((ulong)uVar30 >> 0x20);
      m_15.m[8] = (float)(int)uVar31;
      m_15.m[9] = (float)(int)((ulong)uVar31 >> 0x20);
      m_15.m[10] = (float)(int)uVar32;
      m_15.m[0xb] = (float)(int)((ulong)uVar32 >> 0x20);
      m_15.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      m_15.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      mat4_transpose(m_15);
      m_16.m[2] = (float)(undefined4)uStack_bd0;
      m_16.m[3] = (float)uStack_bd0._4_4_;
      m_16.m[0] = (float)(undefined4)local_bd8;
      m_16.m[1] = (float)local_bd8._4_4_;
      m_16.m[4] = (float)(int)local_bc8;
      m_16.m[5] = (float)(int)((ulong)local_bc8 >> 0x20);
      m_16.m[6] = (float)(int)uStack_bc0;
      m_16.m[7] = (float)(int)((ulong)uStack_bc0 >> 0x20);
      m_16.m[8] = (float)(int)local_bb8;
      m_16.m[9] = (float)(int)((ulong)local_bb8 >> 0x20);
      m_16.m[10] = (float)(int)uStack_bb0;
      m_16.m[0xb] = (float)(int)((ulong)uStack_bb0 >> 0x20);
      m_16.m[0xc] = (float)(undefined4)local_ba8;
      m_16.m[0xd] = (float)local_ba8._4_4_;
      m_16.m[0xe] = (float)(undefined4)uStack_ba0;
      m_16.m[0xf] = (float)uStack_ba0._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_16);
      m_17.m[2] = model_mat.m[2];
      m_17.m[3] = model_mat.m[3];
      m_17.m[0] = model_mat.m[0];
      m_17.m[1] = model_mat.m[1];
      m_17.m[4] = model_mat.m[4];
      m_17.m[5] = model_mat.m[5];
      m_17.m[6] = model_mat.m[6];
      m_17.m[7] = model_mat.m[7];
      m_17.m[8] = model_mat.m[8];
      m_17.m[9] = model_mat.m[9];
      m_17.m[10] = model_mat.m[10];
      m_17.m[0xb] = model_mat.m[0xb];
      m_17.m[0xc] = model_mat.m[0xc];
      m_17.m[0xd] = model_mat.m[0xd];
      m_17.m[0xe] = model_mat.m[0xe];
      m_17.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_17);
      m_18.m[2] = (float)(undefined4)uStack_c10;
      m_18.m[3] = (float)uStack_c10._4_4_;
      m_18.m[0] = (float)(undefined4)local_c18;
      m_18.m[1] = (float)local_c18._4_4_;
      m_18.m[4] = (float)(int)local_c08;
      m_18.m[5] = (float)(int)((ulong)local_c08 >> 0x20);
      m_18.m[6] = (float)(int)uStack_c00;
      m_18.m[7] = (float)(int)((ulong)uStack_c00 >> 0x20);
      m_18.m[8] = (float)(int)local_bf8;
      m_18.m[9] = (float)(int)((ulong)local_bf8 >> 0x20);
      m_18.m[10] = (float)(int)uStack_bf0;
      m_18.m[0xb] = (float)(int)((ulong)uStack_bf0 >> 0x20);
      m_18.m[0xc] = (float)(undefined4)local_be8;
      m_18.m[0xd] = (float)local_be8._4_4_;
      m_18.m[0xe] = (float)(undefined4)uStack_be0;
      m_18.m[0xf] = (float)uStack_be0._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_18);
      local_f80.ptr = pgVar49->data;
      local_f80.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f80);
      pgVar49 = golf_shader_get_fs_uniform(pgVar47,"fs_params");
      golf_shader_uniform_set_float(pgVar49,"alpha",1.0);
      local_f90.ptr = pgVar49->data;
      local_f90.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f90);
      memset((sg_bindings *)&moved_transform,0,0xb0);
      moved_transform.position.y = (float)(pgVar43->sg_positions_buf).id;
      uVar8 = pgVar43->sg_normals_buf;
      uVar16 = pgVar43->sg_texcoords_buf;
      moved_transform.rotation.x = (float)uVar8;
      moved_transform.position.z = (float)uVar16;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      num_elements = (pgVar43->positions).length;
      goto LAB_0010eb62;
    }
    uVar42 = (ulong)(uint)(level->entities).length;
    lVar59 = lVar59 + 0x510;
  }
  pgVar47 = golf_data_get_shader("data/shaders/editor_water.glsl");
  pgVar48 = golf_shader_get_pipeline(pgVar47,"editor_water");
  sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
  lVar59 = 0;
  for (lVar60 = 0; lVar60 < (level->entities).length; lVar60 = lVar60 + 1) {
    pgVar57 = (level->entities).data;
    if ((pgVar57->name[lVar59 + -0xc] == '\x01') && (*(int *)(pgVar57->name + lVar59 + -4) == 4)) {
      pgVar57 = (golf_entity_t *)(pgVar57->name + lVar59 + -0xc);
      pgVar43 = golf_entity_get_model(pgVar57);
      golf_entity_get_world_transform(&world_transform_1,level,pgVar57);
      transform_03.position.z = world_transform_1.position.z;
      transform_03.rotation.x = world_transform_1.rotation.x;
      transform_03.position.x = world_transform_1.position.x;
      transform_03.position.y = world_transform_1.position.y;
      transform_03.rotation.y = world_transform_1.rotation.y;
      transform_03.rotation.z = world_transform_1.rotation.z;
      transform_03.rotation.w = world_transform_1.rotation.w;
      transform_03.scale.x = world_transform_1.scale.x;
      transform_03.scale.y = world_transform_1.scale.y;
      transform_03.scale.z = world_transform_1.scale.z;
      golf_transform_get_model_mat(transform_03);
      golf_data_get_texture("data/textures/colors/white.png");
      golf_data_get_texture("data/textures/water_noise_1.png");
      golf_data_get_texture("data/textures/water_noise_2.png");
      pgVar46 = golf_entity_get_lightmap_section(pgVar57);
      memset(&moved_transform,0,0xb0);
      moved_transform.position.y = (float)(pgVar43->sg_positions_buf).id;
      moved_transform.rotation.x = (float)(pgVar46->sg_uvs_buf).id;
      moved_transform.position.z = (float)(pgVar43->sg_texcoords_buf).id;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      pgVar49 = golf_shader_get_vs_uniform(pgVar47,"editor_water_vs_params");
      m_19.m[2] = model_mat.m[2];
      m_19.m[3] = model_mat.m[3];
      m_19.m[0] = model_mat.m[0];
      m_19.m[1] = model_mat.m[1];
      m_19.m[4] = model_mat.m[4];
      m_19.m[5] = model_mat.m[5];
      m_19.m[6] = model_mat.m[6];
      m_19.m[7] = model_mat.m[7];
      m_19.m[8] = model_mat.m[8];
      m_19.m[9] = model_mat.m[9];
      m_19.m[10] = model_mat.m[10];
      m_19.m[0xb] = model_mat.m[0xb];
      m_19.m[0xc] = model_mat.m[0xc];
      m_19.m[0xd] = model_mat.m[0xd];
      m_19.m[0xe] = model_mat.m[0xe];
      m_19.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_19);
      m_20.m[3] = rotation_mat.m[3];
      m_20.m[2] = rotation_mat.m[2];
      m_20.m[0] = rotation_mat.m[0];
      m_20.m[1] = rotation_mat.m[1];
      m_20.m[4] = rotation_mat.m[4];
      m_20.m[5] = rotation_mat.m[5];
      m_20.m[6] = rotation_mat.m[6];
      m_20.m[7] = rotation_mat.m[7];
      m_20.m[8] = rotation_mat.m[8];
      m_20.m[9] = rotation_mat.m[9];
      m_20.m[10] = rotation_mat.m[10];
      m_20.m[0xb] = rotation_mat.m[0xb];
      m_20.m[0xc] = rotation_mat.m[0xc];
      m_20.m[0xd] = rotation_mat.m[0xd];
      m_20.m[0xe] = rotation_mat.m[0xe];
      m_20.m[0xf] = rotation_mat.m[0xf];
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_20);
      pmVar1 = &graphics->proj_view_mat;
      transform.position.x = pmVar1->m[0];
      transform.position.y = pmVar1->m[1];
      uVar30 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
      transform.rotation.y = (graphics->proj_view_mat).m[4];
      transform.rotation.z = (graphics->proj_view_mat).m[5];
      uVar31 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      transform.scale.y = (graphics->proj_view_mat).m[8];
      transform.scale.z = (graphics->proj_view_mat).m[9];
      uStack_1080 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      local_1078 = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      uStack_1070 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      transform.rotation.w = (float)uVar31;
      transform.scale.x = (float)((ulong)uVar31 >> 0x20);
      transform.position.z = (float)uVar30;
      transform.rotation.x = (float)((ulong)uVar30 >> 0x20);
      m_21.m[5] = transform.rotation.z;
      m_21.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m_21.m[6] = transform.rotation.w;
      m_21.m[7] = transform.scale.x;
      m_21.m[8] = transform.scale.y;
      m_21.m[9] = transform.scale.z;
      m_21.m[10] = (float)(int)uStack_1080;
      m_21.m[0xb] = (float)(int)((ulong)uStack_1080 >> 0x20);
      m_21.m[0xc] = (float)(int)local_1078;
      m_21.m[0xd] = (float)(int)((ulong)local_1078 >> 0x20);
      m_21.m[0xe] = (float)(int)uStack_1070;
      m_21.m[0xf] = (float)(int)((ulong)uStack_1070 >> 0x20);
      mat4_transpose(m_21);
      m_22.m[2] = local_1138.m[2];
      m_22.m[3] = local_1138.m[3];
      m_22.m[0] = local_1138.m[0];
      m_22.m[1] = local_1138.m[1];
      m_22.m[4] = local_1138.m[4];
      m_22.m[5] = local_1138.m[5];
      m_22.m[6] = local_1138.m[6];
      m_22.m[7] = local_1138.m[7];
      m_22.m[8] = local_1138.m[8];
      m_22.m[9] = local_1138.m[9];
      m_22.m[10] = local_1138.m[10];
      m_22.m[0xb] = local_1138.m[0xb];
      m_22.m[0xc] = local_1138.m[0xc];
      m_22.m[0xd] = local_1138.m[0xd];
      m_22.m[0xe] = local_1138.m[0xe];
      m_22.m[0xf] = local_1138.m[0xf];
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_22);
      local_fa0.ptr = pgVar49->data;
      local_fa0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fa0);
      pgVar49 = golf_shader_get_fs_uniform(pgVar47,"editor_water_fs_params");
      golf_shader_uniform_set_float(pgVar49,"draw_type",0.0);
      golf_shader_uniform_set_float(pgVar49,"t",editor->t);
      local_fb0.ptr = pgVar49->data;
      local_fb0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fb0);
      sg_draw(L'\0',(pgVar43->positions).length,L'\x01');
    }
    lVar59 = lVar59 + 0x510;
  }
  pgVar47 = golf_data_get_shader("data/shaders/pass_through.glsl");
  pgVar48 = golf_shader_get_pipeline(pgVar47,"hole_pass_1");
  sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
  lVar59 = 0;
  for (lVar60 = 0; lVar60 < (level->entities).length; lVar60 = lVar60 + 1) {
    pgVar57 = (level->entities).data;
    if ((pgVar57->name[lVar59 + -0xc] == '\x01') && (*(int *)(pgVar57->name + lVar59 + -4) == 2)) {
      uVar30 = *(undefined8 *)(pgVar57->name + lVar59 + 0x44);
      transform_2._8_8_ = *(undefined8 *)(pgVar57->name + lVar59 + 0x44 + 8);
      transform_2.rotation._4_8_ = *(undefined8 *)(pgVar57->name + lVar59 + 0x54);
      transform_2._24_8_ = *(undefined8 *)(pgVar57->name + lVar59 + 0x54 + 8);
      transform_2.scale._4_8_ = *(undefined8 *)(pgVar57->name + lVar59 + 100);
      transform_2.position.y = (float)((ulong)uVar30 >> 0x20);
      transform_2.position.y = transform_2.position.y + 0.001;
      transform_2.position.x = (float)uVar30;
      transform_04.position.z = transform_2.position.z;
      transform_04.rotation.x = transform_2.rotation.x;
      transform_04.position.x = transform_2.position.x;
      transform_04.position.y = transform_2.position.y;
      transform_04.rotation.y = transform_2.rotation.y;
      transform_04.rotation.z = transform_2.rotation.z;
      transform_04.rotation.w = transform_2.rotation.w;
      transform_04.scale.x = transform_2.scale.x;
      transform_04.scale.y = transform_2.scale.y;
      transform_04.scale.z = transform_2.scale.z;
      golf_transform_get_model_mat(transform_04);
      pgVar43 = golf_data_get_model("data/models/hole-cover.obj");
      pgVar49 = golf_shader_get_vs_uniform(pgVar47,"pass_through_vs_params");
      pmVar1 = &graphics->proj_view_mat;
      moved_transform.position.x = pmVar1->m[0];
      moved_transform.position.y = pmVar1->m[1];
      moved_transform.position.z = (graphics->proj_view_mat).m[2];
      moved_transform.rotation.x = (graphics->proj_view_mat).m[3];
      pfVar2 = (graphics->proj_view_mat).m + 4;
      uVar30 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      moved_transform._16_16_ = *(undefined1 (*) [16])pfVar2;
      pfVar3 = (graphics->proj_view_mat).m + 8;
      uVar31 = *(undefined8 *)pfVar3;
      uVar32 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      unique0x10009d3d = *(undefined1 (*) [16])pfVar3;
      m1.m[5] = (float)(int)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      m1.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m1.m[6] = (float)(int)uVar30;
      m1.m[7] = (float)(int)((ulong)uVar30 >> 0x20);
      m1.m[8] = (float)(int)uVar31;
      m1.m[9] = (float)(int)((ulong)uVar31 >> 0x20);
      m1.m[10] = (float)(int)uVar32;
      m1.m[0xb] = (float)(int)((ulong)uVar32 >> 0x20);
      m1.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      m1.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      m2.m[2] = model_mat.m[2];
      m2.m[3] = model_mat.m[3];
      m2.m[0] = model_mat.m[0];
      m2.m[1] = model_mat.m[1];
      m2.m[4] = model_mat.m[4];
      m2.m[5] = model_mat.m[5];
      m2.m[6] = model_mat.m[6];
      m2.m[7] = model_mat.m[7];
      m2.m[8] = model_mat.m[8];
      m2.m[9] = model_mat.m[9];
      m2.m[10] = model_mat.m[10];
      m2.m[0xb] = model_mat.m[0xb];
      m2.m[0xc] = model_mat.m[0xc];
      m2.m[0xd] = model_mat.m[0xd];
      m2.m[0xe] = model_mat.m[0xe];
      m2.m[0xf] = model_mat.m[0xf];
      mat4_multiply(m1,m2);
      m_23.m[2] = world_transform_1.position.z;
      m_23.m[3] = world_transform_1.rotation.x;
      m_23.m[0] = world_transform_1.position.x;
      m_23.m[1] = world_transform_1.position.y;
      m_23.m[4] = world_transform_1.rotation.y;
      m_23.m[5] = world_transform_1.rotation.z;
      m_23.m[6] = world_transform_1.rotation.w;
      m_23.m[7] = world_transform_1.scale.x;
      m_23.m[8] = world_transform_1.scale.y;
      m_23.m[9] = world_transform_1.scale.z;
      m_23.m[10] = (float)(int)uStack_db8;
      m_23.m[0xb] = (float)(int)((ulong)uStack_db8 >> 0x20);
      m_23.m._48_8_ = local_db0;
      m_23.m._56_8_ = uStack_da8;
      mat4_transpose(m_23);
      m_24.m[3] = transform.rotation.x;
      m_24.m[2] = transform.position.z;
      m_24.m[0] = transform.position.x;
      m_24.m[1] = transform.position.y;
      m_24.m[4] = transform.rotation.y;
      m_24.m[5] = transform.rotation.z;
      m_24.m[6] = transform.rotation.w;
      m_24.m[7] = transform.scale.x;
      m_24.m[8] = transform.scale.y;
      m_24.m[9] = transform.scale.z;
      m_24.m[10] = (float)(int)uStack_1080;
      m_24.m[0xb] = (float)(int)((ulong)uStack_1080 >> 0x20);
      m_24.m[0xc] = (float)(undefined4)local_1078;
      m_24.m[0xd] = (float)local_1078._4_4_;
      m_24.m[0xe] = (float)(undefined4)uStack_1070;
      m_24.m[0xf] = (float)uStack_1070._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"mvp_mat",m_24);
      local_fc0.ptr = pgVar49->data;
      local_fc0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fc0);
      memset((sg_bindings *)&moved_transform,0,0xb0);
      moved_transform.position.y = (float)(pgVar43->sg_positions_buf).id;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      sg_draw(L'\0',(pgVar43->positions).length,L'\x01');
    }
    lVar59 = lVar59 + 0x510;
  }
  pgVar47 = golf_data_get_shader("data/shaders/texture_material.glsl");
  pgVar48 = golf_shader_get_pipeline(pgVar47,"hole_pass_2");
  sg_apply_pipeline((sg_pipeline)(pgVar48->sg_pipeline).id);
  lVar60 = 0;
  for (lVar59 = 0; lVar59 < (level->entities).length; lVar59 = lVar59 + 1) {
    pgVar57 = (level->entities).data;
    if ((pgVar57->name[lVar60 + -0xc] == '\x01') && (*(int *)(pgVar57->name + lVar60 + -4) == 2)) {
      uVar30 = *(undefined8 *)(pgVar57->name + lVar60 + 0x44);
      uVar31 = *(undefined8 *)(pgVar57->name + lVar60 + 0x54);
      uVar32 = *(undefined8 *)(pgVar57->name + lVar60 + 0x54 + 8);
      transform_3.position.y = (float)((ulong)uVar30 >> 0x20);
      transform_3.position.x = (float)uVar30;
      transform_05._8_8_ = *(undefined8 *)(pgVar57->name + lVar60 + 0x44 + 8);
      transform_05.position.x = transform_3.position.x;
      transform_05.position.y = transform_3.position.y + 0.001;
      transform_05.rotation.y = (float)(int)uVar31;
      transform_05.rotation.z = (float)(int)((ulong)uVar31 >> 0x20);
      transform_05.rotation.w = (float)(int)uVar32;
      transform_05.scale.x = (float)(int)((ulong)uVar32 >> 0x20);
      transform_05.scale.y = (float)(int)*(undefined8 *)(pgVar57->name + lVar60 + 100);
      transform_05.scale.z = (float)((ulong)*(undefined8 *)(pgVar57->name + lVar60 + 100) >> 0x20);
      golf_transform_get_model_mat(transform_05);
      pgVar43 = golf_data_get_model("data/models/hole.obj");
      golf_data_get_texture("data/textures/hole_lightmap.png");
      pgVar49 = golf_shader_get_vs_uniform(pgVar47,"texture_material_vs_params");
      pmVar1 = &graphics->proj_view_mat;
      moved_transform.position.x = pmVar1->m[0];
      moved_transform.position.y = pmVar1->m[1];
      moved_transform.position.z = (graphics->proj_view_mat).m[2];
      moved_transform.rotation.x = (graphics->proj_view_mat).m[3];
      pfVar2 = (graphics->proj_view_mat).m + 4;
      uVar30 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
      moved_transform._16_16_ = *(undefined1 (*) [16])pfVar2;
      pfVar3 = (graphics->proj_view_mat).m + 8;
      uVar31 = *(undefined8 *)pfVar3;
      uVar32 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
      unique0x10009d91 = *(undefined1 (*) [16])pfVar3;
      m_25.m[5] = (float)(int)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      m_25.m._0_20_ = *(undefined1 (*) [20])pmVar1->m;
      m_25.m[6] = (float)(int)uVar30;
      m_25.m[7] = (float)(int)((ulong)uVar30 >> 0x20);
      m_25.m[8] = (float)(int)uVar31;
      m_25.m[9] = (float)(int)((ulong)uVar31 >> 0x20);
      m_25.m[10] = (float)(int)uVar32;
      m_25.m[0xb] = (float)(int)((ulong)uVar32 >> 0x20);
      m_25.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
      m_25.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
      mat4_transpose(m_25);
      m_26.m[2] = transform_2.position.z;
      m_26.m[3] = transform_2.rotation.x;
      m_26.m[0] = transform_2.position.x;
      m_26.m[1] = transform_2.position.y;
      m_26.m[4] = transform_2.rotation.y;
      m_26.m[5] = transform_2.rotation.z;
      m_26.m[6] = transform_2.rotation.w;
      m_26.m[7] = transform_2.scale.x;
      m_26.m[8] = transform_2.scale.y;
      m_26.m[9] = transform_2.scale.z;
      m_26.m[10] = (float)(int)uStack_1020;
      m_26.m[0xb] = (float)(int)((ulong)uStack_1020 >> 0x20);
      m_26.m._48_8_ = local_1018;
      m_26.m._56_8_ = uStack_1010;
      golf_shader_uniform_set_mat4(pgVar49,"proj_view_mat",m_26);
      m_27.m[2] = model_mat.m[2];
      m_27.m[3] = model_mat.m[3];
      m_27.m[0] = model_mat.m[0];
      m_27.m[1] = model_mat.m[1];
      m_27.m[4] = model_mat.m[4];
      m_27.m[5] = model_mat.m[5];
      m_27.m[6] = model_mat.m[6];
      m_27.m[7] = model_mat.m[7];
      m_27.m[8] = model_mat.m[8];
      m_27.m[9] = model_mat.m[9];
      m_27.m[10] = model_mat.m[10];
      m_27.m[0xb] = model_mat.m[0xb];
      m_27.m[0xc] = model_mat.m[0xc];
      m_27.m[0xd] = model_mat.m[0xd];
      m_27.m[0xe] = model_mat.m[0xe];
      m_27.m[0xf] = model_mat.m[0xf];
      mat4_transpose(m_27);
      m_28.m[2] = (float)(undefined4)uStack_c50;
      m_28.m[3] = (float)uStack_c50._4_4_;
      m_28.m[0] = (float)(undefined4)local_c58;
      m_28.m[1] = (float)local_c58._4_4_;
      m_28.m[4] = (float)(int)local_c48;
      m_28.m[5] = (float)(int)((ulong)local_c48 >> 0x20);
      m_28.m[6] = (float)(int)uStack_c40;
      m_28.m[7] = (float)(int)((ulong)uStack_c40 >> 0x20);
      m_28.m[8] = (float)(int)local_c38;
      m_28.m[9] = (float)(int)((ulong)local_c38 >> 0x20);
      m_28.m[10] = (float)(int)uStack_c30;
      m_28.m[0xb] = (float)(int)((ulong)uStack_c30 >> 0x20);
      m_28.m[0xc] = (float)(undefined4)local_c28;
      m_28.m[0xd] = (float)local_c28._4_4_;
      m_28.m[0xe] = (float)(undefined4)uStack_c20;
      m_28.m[0xf] = (float)uStack_c20._4_4_;
      golf_shader_uniform_set_mat4(pgVar49,"model_mat",m_28);
      local_fd0.ptr = pgVar49->data;
      local_fd0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fd0);
      pgVar49 = golf_shader_get_fs_uniform(pgVar47,"fs_params");
      golf_shader_uniform_set_float(pgVar49,"alpha",1.0);
      local_fe0.ptr = pgVar49->data;
      local_fe0.size = (size_t)pgVar49->size;
      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fe0);
      memset((sg_bindings *)&moved_transform,0,0xb0);
      moved_transform.position.y = (float)(pgVar43->sg_positions_buf).id;
      uVar9 = pgVar43->sg_normals_buf;
      uVar17 = pgVar43->sg_texcoords_buf;
      moved_transform.rotation.x = (float)uVar9;
      moved_transform.position.z = (float)uVar17;
      sg_apply_bindings((sg_bindings *)&moved_transform);
      sg_draw(L'\0',(pgVar43->positions).length,L'\x01');
    }
    lVar60 = lVar60 + 0x510;
  }
  if (editor->in_edit_mode == true) {
    pgVar25 = (editor->edit_mode).geo;
    uVar24 = (editor->edit_mode).transform.scale.y;
    uVar29 = (editor->edit_mode).transform.scale.z;
    uVar33 = (editor->edit_mode).transform.rotation.z;
    uVar34 = (editor->edit_mode).transform.position.x;
    uVar35 = (editor->edit_mode).transform.position.y;
    uVar36 = (editor->edit_mode).transform.position.z;
    transform_06.position.z = (float)uVar36;
    transform_06.position.y = (float)uVar35;
    transform_06.position.x = (float)uVar34;
    uVar37 = (editor->edit_mode).transform.rotation.x;
    uVar38 = (editor->edit_mode).transform.rotation.y;
    transform_06.rotation.y = (float)uVar38;
    transform_06.rotation.x = (float)uVar37;
    uVar30 = *(undefined8 *)&(editor->edit_mode).transform.rotation.w;
    transform_06.rotation.z = (float)uVar33;
    transform_06.rotation.w = (float)(int)uVar30;
    transform_06.scale.x = (float)(int)((ulong)uVar30 >> 0x20);
    transform_06.scale.y = (float)uVar24;
    transform_06.scale.z = (float)uVar29;
    golf_transform_get_model_mat(transform_06);
    lVar59 = 0;
    for (lVar60 = 0; lVar60 < (pgVar25->points).length; lVar60 = lVar60 + 1) {
      pgVar26 = (pgVar25->points).data;
      if (((&pgVar26->active)[lVar59] & 1U) != 0) {
        m_29.m[2] = model_mat.m[2];
        m_29.m[3] = model_mat.m[3];
        m_29.m[0] = model_mat.m[0];
        m_29.m[1] = model_mat.m[1];
        m_29.m[4] = model_mat.m[4];
        m_29.m[5] = model_mat.m[5];
        m_29.m[6] = model_mat.m[6];
        m_29.m[7] = model_mat.m[7];
        m_29.m[8] = model_mat.m[8];
        m_29.m[9] = model_mat.m[9];
        m_29.m[10] = model_mat.m[10];
        m_29.m[0xb] = model_mat.m[0xb];
        m_29.m[0xc] = model_mat.m[0xc];
        m_29.m[0xd] = model_mat.m[0xd];
        m_29.m[0xe] = model_mat.m[0xe];
        m_29.m[0xf] = model_mat.m[0xf];
        v_01.z = *(float *)((long)&(pgVar26->position).z + lVar59);
        v_01._0_8_ = *(undefined8 *)((long)&(pgVar26->position).x + lVar59);
        vVar66 = vec3_apply_mat4(v_01,1.0,m_29);
        fVar63 = golf_config_get_num(cfg,"edit_mode_sphere_size");
        mat4_translation(&local_c98,vVar66);
        vVar66 = vec3_create(fVar63,fVar63,fVar63);
        mat4_scale(&local_cd8,vVar66);
        mat4_multiply_n((mat4 *)&lightmap_image,2);
        pgVar43 = golf_data_get_model("data/models/sphere.obj");
        iVar20 = (pgVar43->positions).length;
        vVar66 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
        gVar69 = golf_edit_mode_entity_point((int)lVar60);
        _Var40 = golf_editor_is_edit_entity_hovered(gVar69);
        pcVar52 = "edit_mode_hovered_color";
        if (_Var40) {
LAB_0010f722:
          vVar66 = golf_config_get_vec3(cfg,pcVar52);
        }
        else {
          _Var40 = golf_editor_is_edit_entity_selected(gVar69);
          pcVar52 = "edit_mode_selected_color";
          if (_Var40) goto LAB_0010f722;
        }
        vVar65 = vec4_create(vVar66.x,vVar66.y,vVar66.z,1.0);
        golf_material_color((golf_material_t *)&moved_transform,"",0.0,0.0,0.0,vVar65);
        pgVar53 = (golf_material_t *)&moved_transform;
        puVar55 = (undefined8 *)&stack0xffffffffffffea08;
        for (lVar50 = 0x8c; lVar50 != 0; lVar50 = lVar50 + -1) {
          *puVar55 = *(undefined8 *)pgVar53;
          pgVar53 = (golf_material_t *)((long)pgVar53 + (ulong)bVar61 * -0x10 + 8);
          puVar55 = puVar55 + (ulong)bVar61 * -2 + 1;
        }
        _golf_renderer_draw_solid_color_material(pgVar43,0,iVar20);
      }
      lVar59 = lVar59 + 0x10;
    }
    for (lVar59 = 0; lVar59 < (pgVar25->faces).length; lVar59 = lVar59 + 1) {
      pgVar27 = (pgVar25->faces).data;
      if ((pgVar27[lVar59].active & 1U) != 0) {
        piVar28 = pgVar27[lVar59].idx.data;
        uVar21 = pgVar27[lVar59].idx.length;
        iVar20 = pgVar27[lVar59].start_vertex_in_model;
        uVar42 = 0;
        if (0 < (int)uVar21) {
          uVar42 = (ulong)uVar21;
        }
        local_10f0 = lVar59;
        for (uVar58 = 0; lVar59 = local_10f0, uVar42 != uVar58; uVar58 = uVar58 + 1) {
          iVar22 = piVar28[uVar58];
          iVar23 = piVar28[(long)((int)uVar58 + 1) % (long)(int)uVar21 & 0xffffffff];
          pgVar26 = (pgVar25->points).data;
          uVar10 = pgVar26[iVar22].position.x;
          uVar18 = pgVar26[iVar22].position.y;
          v_02.y = (float)uVar18;
          v_02.x = (float)uVar10;
          uVar11 = pgVar26[iVar23].position.x;
          uVar19 = pgVar26[iVar23].position.y;
          v_03.y = (float)uVar19;
          v_03.x = (float)uVar11;
          fVar63 = pgVar26[iVar23].position.z;
          m_30.m[2] = model_mat.m[2];
          m_30.m[3] = model_mat.m[3];
          m_30.m[0] = model_mat.m[0];
          m_30.m[1] = model_mat.m[1];
          m_30.m[4] = model_mat.m[4];
          m_30.m[5] = model_mat.m[5];
          m_30.m[6] = model_mat.m[6];
          m_30.m[7] = model_mat.m[7];
          m_30.m[8] = model_mat.m[8];
          m_30.m[9] = model_mat.m[9];
          m_30.m[10] = model_mat.m[10];
          m_30.m[0xb] = model_mat.m[0xb];
          m_30.m[0xc] = model_mat.m[0xc];
          m_30.m[0xd] = model_mat.m[0xd];
          m_30.m[0xe] = model_mat.m[0xe];
          m_30.m[0xf] = model_mat.m[0xf];
          v_02.z = pgVar26[iVar22].position.z;
          vVar67 = vec3_apply_mat4(v_02,1.0,m_30);
          m_31.m[2] = model_mat.m[2];
          m_31.m[3] = model_mat.m[3];
          m_31.m[0] = model_mat.m[0];
          m_31.m[1] = model_mat.m[1];
          m_31.m[4] = model_mat.m[4];
          m_31.m[5] = model_mat.m[5];
          m_31.m[6] = model_mat.m[6];
          m_31.m[7] = model_mat.m[7];
          m_31.m[8] = model_mat.m[8];
          m_31.m[9] = model_mat.m[9];
          m_31.m[10] = model_mat.m[10];
          m_31.m[0xb] = model_mat.m[0xb];
          m_31.m[0xc] = model_mat.m[0xc];
          m_31.m[0xd] = model_mat.m[0xd];
          m_31.m[0xe] = model_mat.m[0xe];
          m_31.m[0xf] = model_mat.m[0xf];
          v_03.z = fVar63;
          vVar68 = vec3_apply_mat4(v_03,1.0,m_31);
          local_10f8 = CONCAT44(local_10f8._4_4_,vVar68.z);
          fVar63 = golf_config_get_num(cfg,"edit_mode_line_size");
          vVar66 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
          gVar69 = golf_edit_mode_entity_line(iVar22,iVar23);
          _Var40 = golf_editor_is_edit_entity_hovered(gVar69);
          pcVar52 = "edit_mode_hovered_color";
          if (_Var40) {
LAB_0010f9d1:
            vVar66 = golf_config_get_vec3(cfg,pcVar52);
            fVar63 = fVar63 + 0.001;
          }
          else {
            _Var40 = golf_editor_is_edit_entity_selected(gVar69);
            pcVar52 = "edit_mode_selected_color";
            if (_Var40) goto LAB_0010f9d1;
          }
          p1.z = (float)local_10f8;
          p1.x = (float)(int)vVar68._0_8_;
          p1.y = (float)(int)((ulong)vVar68._0_8_ >> 0x20);
          mat4_box_to_line_transform((mat4 *)&lightmap_image,vVar67,p1,fVar63);
          pgVar43 = golf_data_get_model("data/models/cube.obj");
          iVar22 = (pgVar43->positions).length;
          local_1198 = vVar66.x;
          fStack_1194 = vVar66.y;
          vVar65 = vec4_create(local_1198,fStack_1194,vVar66.z,1.0);
          golf_material_color((golf_material_t *)&moved_transform,"",0.0,0.0,0.0,vVar65);
          pgVar53 = (golf_material_t *)&moved_transform;
          puVar55 = (undefined8 *)&stack0xffffffffffffea08;
          for (lVar59 = 0x8c; lVar59 != 0; lVar59 = lVar59 + -1) {
            *puVar55 = *(undefined8 *)pgVar53;
            pgVar53 = (golf_material_t *)((long)pgVar53 + (ulong)bVar61 * -0x10 + 8);
            puVar55 = puVar55 + (ulong)bVar61 * -2 + 1;
          }
          _golf_renderer_draw_solid_color_material(pgVar43,0,iVar22);
        }
        gVar69 = golf_edit_mode_entity_face((int)local_10f0);
        _Var40 = golf_editor_is_edit_entity_hovered(gVar69);
        if (_Var40) {
          vVar66 = golf_config_get_vec3(cfg,"edit_mode_hovered_color");
          pcVar52 = "edit_mode_hovered_face_alpha";
        }
        else {
          _Var40 = golf_editor_is_edit_entity_selected(gVar69);
          if (!_Var40) goto LAB_0010fc71;
          vVar66 = golf_config_get_vec3(cfg,"edit_mode_selected_color");
          pcVar52 = "edit_mode_selected_face_alpha";
        }
        fVar63 = golf_config_get_num(cfg,pcVar52);
        local_1188 = vVar66.x;
        fStack_1184 = vVar66.y;
        vVar65 = vec4_create(local_1188,fStack_1184,vVar66.z,fVar63);
        golf_material_color((golf_material_t *)&moved_transform,"",0.0,0.0,0.0,vVar65);
        pgVar53 = (golf_material_t *)&moved_transform;
        puVar55 = (undefined8 *)&stack0xffffffffffffea08;
        for (lVar60 = 0x8c; lVar60 != 0; lVar60 = lVar60 + -1) {
          *puVar55 = *(undefined8 *)pgVar53;
          pgVar53 = (golf_material_t *)((long)pgVar53 + (ulong)bVar61 * -0x10 + 8);
          puVar55 = puVar55 + (ulong)bVar61 * -2 + 1;
        }
        _golf_renderer_draw_solid_color_material(&pgVar25->model,iVar20,uVar21 * 3 + -6);
      }
LAB_0010fc71:
    }
  }
  sg_end_pass();
  return;
}

Assistant:

void golf_editor_draw(void) {
    golf_config_t *editor_cfg = golf_data_get_config("data/config/editor.cfg");

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0, 0, 0, 1 },
        },
    };
    sg_begin_default_pass(&action, (int)graphics->viewport_size.x, (int)graphics->viewport_size.y);

    _draw_level();

    if (editor->in_edit_mode) {
        golf_geo_t *geo = editor->edit_mode.geo;
        mat4 model_mat = golf_transform_get_model_mat(editor->edit_mode.transform);

        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t p = geo->points.data[i];
            if (!p.active) continue;

            vec3 pos = vec3_apply_mat4(p.position, 1, model_mat);
            float sz = CFG_NUM(editor_cfg, "edit_mode_sphere_size");
            mat4 sphere_model_mat = mat4_multiply_n(2, mat4_translation(pos), mat4_scale(V3(sz, sz, sz)));
            golf_model_t *model = golf_data_get_model("data/models/sphere.obj");
            int start = 0;
            int count = model->positions.length;
            vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
            golf_edit_mode_entity_t entity = golf_edit_mode_entity_point(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {  
                color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
            }
            golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
            _golf_renderer_draw_solid_color_material(model, start, count, sphere_model_mat, material);
        }

        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];
            if (!face.active) continue;

            int n = face.idx.length;
            for (int i = 0; i < n; i++) {
                int idx0 = face.idx.data[i];
                int idx1 = face.idx.data[(i + 1) % n];
                golf_geo_point_t p0 = geo->points.data[idx0];
                golf_geo_point_t p1 = geo->points.data[idx1];
                vec3 pos0 = vec3_apply_mat4(p0.position, 1, model_mat);
                vec3 pos1 = vec3_apply_mat4(p1.position, 1, model_mat);
                //vec3 pos_avg = vec3_scale(vec3_add(pos0, pos1), 0.5f);
                float sz = CFG_NUM(editor_cfg, "edit_mode_line_size");
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
                golf_edit_mode_entity_t entity = golf_edit_mode_entity_line(idx0, idx1);
                if (golf_editor_is_edit_entity_hovered(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                    sz += 0.001f;
                }
                else if (golf_editor_is_edit_entity_selected(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                    sz += 0.001f;
                }
                mat4 line_model_mat = mat4_box_to_line_transform(pos0, pos1, sz);
                golf_model_t *model = golf_data_get_model("data/models/cube.obj");
                int start = 0;
                int count = model->positions.length;
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
                _golf_renderer_draw_solid_color_material(model, start, count, line_model_mat, material);
            }

            golf_edit_mode_entity_t entity = golf_edit_mode_entity_face(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_hovered_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_selected_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
        }
    }

    sg_end_pass();
}